

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 UVar1;
  U32 *pUVar2;
  U16 *pUVar3;
  BYTE *pBVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  U16 *pUVar10;
  U32 h;
  BYTE *p;
  uint local_128;
  U32 mls;
  U32 rowMask;
  U32 rowLog;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  U32 pos;
  BYTE *tagRow;
  U32 *row;
  U32 relRow;
  U32 hash;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 hashLog;
  U16 *tagTable;
  U32 *hashTable;
  uint local_90;
  U32 hash_1;
  U32 row_1;
  U32 newHash;
  U32 next;
  
  sVar5 = 5;
  if ((ms->cParams).searchLog < 5) {
    sVar5 = 4;
  }
  if ((ms->cParams).minMatch < 6) {
    local_128 = (ms->cParams).minMatch;
  }
  else {
    local_128 = 6;
  }
  pUVar2 = ms->hashTable;
  pUVar3 = ms->tagTable;
  UVar1 = ms->rowHashLog;
  pBVar4 = (ms->window).base;
  uVar6 = (int)ip - (int)pBVar4;
  for (relRow = ms->nextToUpdate; relRow < uVar6; relRow = relRow + 1) {
    p = pBVar4 + relRow;
    h = UVar1 + 8;
    switch(local_128) {
    default:
      sVar9 = ZSTD_hash4Ptr(p,h);
      local_90 = (uint)sVar9;
      break;
    case 5:
      sVar9 = ZSTD_hash5Ptr(p,h);
      local_90 = (uint)sVar9;
      break;
    case 6:
      sVar9 = ZSTD_hash6Ptr(p,h);
      local_90 = (uint)sVar9;
      break;
    case 7:
      sVar9 = ZSTD_hash7Ptr(p,h);
      local_90 = (uint)sVar9;
      break;
    case 8:
      sVar9 = ZSTD_hash8Ptr(p,h);
      local_90 = (uint)sVar9;
    }
    uVar7 = (local_90 >> 8) << sVar5;
    pUVar10 = pUVar3 + uVar7;
    uVar8 = (byte)*pUVar10 - 1 & (1 << sVar5) - 1U;
    *(byte *)pUVar10 = (byte)uVar8;
    *(byte *)((long)pUVar10 + (ulong)(uVar8 + 1)) = (byte)local_90;
    pUVar2[(ulong)uVar7 + (ulong)uVar8] = relRow;
  }
  ms->nextToUpdate = uVar6;
  return;
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* dont use cache */);
}